

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vocab.cc
# Opt level: O0

void __thiscall onmt::Vocab::resize(Vocab *this,size_t maximum_size,size_t minimum_frequency)

{
  bool bVar1;
  reference pvVar2;
  size_type sVar3;
  ulong in_RDX;
  ulong in_RSI;
  long in_RDI;
  bool bVar4;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_false,_true>,_bool>
  pVar5;
  size_t old_id;
  size_t new_id;
  vector<unsigned_long,_std::allocator<unsigned_long>_> new_frequencies;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  new_ids_to_tokens;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  new_tokens_to_ids;
  size_t new_size;
  vector<unsigned_long,_std::allocator<unsigned_long>_> ids;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *in_stack_fffffffffffffe88;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  in_stack_fffffffffffffe98;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffea0;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *this_00;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffea8;
  ulong __new_size;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_fffffffffffffeb0;
  ulong in_stack_fffffffffffffeb8;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  size_type local_e8;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  local_b0;
  size_type local_78;
  unsigned_long *local_68;
  unsigned_long *local_60;
  unsigned_long *local_58;
  unsigned_long *local_50;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_30;
  ulong local_18;
  ulong local_10;
  
  if ((in_RSI != 0) || (in_RDX != 1)) {
    local_18 = in_RDX;
    local_10 = in_RSI;
    size((Vocab *)0x3cf981);
    std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x3cf998);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               in_stack_fffffffffffffeb0._M_current,(size_type)in_stack_fffffffffffffea8._M_current,
               (allocator_type *)in_stack_fffffffffffffea0._M_current);
    std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x3cf9be);
    local_50 = (unsigned_long *)
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          in_stack_fffffffffffffe88);
    local_58 = (unsigned_long *)
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          in_stack_fffffffffffffe88);
    std::
    iota<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
              (in_stack_fffffffffffffea0,
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )in_stack_fffffffffffffe98._M_cur,
               CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
    local_60 = (unsigned_long *)
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          in_stack_fffffffffffffe88);
    local_68 = (unsigned_long *)
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          in_stack_fffffffffffffe88);
    std::
    stable_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,onmt::Vocab::resize(unsigned_long,unsigned_long)::__0>
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
               (anon_class_8_1_8991fb9c)in_stack_fffffffffffffea0._M_current);
    while( true ) {
      bVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::empty
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         in_stack_fffffffffffffea0._M_current);
      bVar4 = false;
      if (!bVar1) {
        pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
        pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x50)
                            ,*pvVar2);
        bVar4 = *pvVar2 < local_18;
      }
      if (!bVar4) break;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::pop_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x3cfacd);
    }
    if (local_10 != 0) {
      while( true ) {
        in_stack_fffffffffffffeb8 = local_10;
        sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_30);
        in_stack_fffffffffffffec7 = false;
        if (in_stack_fffffffffffffeb8 < sVar3) {
          in_stack_fffffffffffffeb0._M_current = (unsigned_long *)(in_RDI + 0x50);
          pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             (&local_30,local_10);
          pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                              in_stack_fffffffffffffeb0._M_current,*pvVar2);
          in_stack_fffffffffffffec7 = *pvVar2 == 0xffffffffffffffff;
        }
        if ((bool)in_stack_fffffffffffffec7 == false) break;
        local_10 = local_10 + 1;
      }
      __new_size = local_10;
      sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_30);
      if (__new_size < sVar3) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffffeb0._M_current,__new_size);
      }
    }
    local_78 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_30);
    this_00 = &local_b0;
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
    ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                     *)0x3cfc13);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x3cfc20);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x3cfc2d);
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
    ::reserve((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
              (size_type)in_stack_fffffffffffffe88);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
              in_stack_fffffffffffffeb8);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0),
               in_stack_fffffffffffffeb8);
    for (local_e8 = 0; local_e8 < local_78; local_e8 = local_e8 + 1) {
      pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&local_30,local_e8);
      sVar3 = *pvVar2;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x50),sVar3);
      std::vector<unsigned_long,std::allocator<unsigned_long>>::emplace_back<unsigned_long&>
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00,
                 (unsigned_long *)in_stack_fffffffffffffe98._M_cur);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(in_RDI + 0x38),sVar3);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)this_00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe98._M_cur);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
      pVar5 = std::
              unordered_map<std::__cxx11::string,unsigned_long,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
              ::emplace<std::__cxx11::string&,unsigned_long&>
                        (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffffe98._M_cur,
                         (unsigned_long *)
                         CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
      in_stack_fffffffffffffe98._M_cur =
           (__node_type *)
           pVar5.first.
           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
           ._M_cur;
      in_stack_fffffffffffffe97 = pVar5.second;
    }
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
    ::operator=((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                 *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
                in_stack_fffffffffffffe88);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this_00,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffe98._M_cur);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               in_stack_fffffffffffffe98._M_cur);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this_00);
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
    ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                      *)0x3cfe01);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00);
  }
  return;
}

Assistant:

void Vocab::resize(size_t maximum_size, size_t minimum_frequency)
  {
    if (maximum_size == 0 && minimum_frequency == 1)
      return;

    std::vector<size_t> ids(size());
    std::iota(ids.begin(), ids.end(), size_t(0));
    std::stable_sort(ids.begin(), ids.end(), [this](size_t i1, size_t i2) {
      return _frequencies[i1] > _frequencies[i2];
    });

    while (!ids.empty() && _frequencies[ids.back()] < minimum_frequency)
      ids.pop_back();

    if (maximum_size > 0)
    {
      while (maximum_size < ids.size() && _frequencies[ids[maximum_size]] == maximum_frequency)
        ++maximum_size;
      if (maximum_size < ids.size())
        ids.resize(maximum_size);
    }

    const size_t new_size = ids.size();

    std::unordered_map<std::string, size_t> new_tokens_to_ids;
    std::vector<std::string> new_ids_to_tokens;
    std::vector<size_t> new_frequencies;
    new_tokens_to_ids.reserve(new_size);
    new_ids_to_tokens.reserve(new_size);
    new_frequencies.reserve(new_size);

    for (size_t new_id = 0; new_id < new_size; ++new_id)
    {
      const size_t old_id = ids[new_id];
      new_frequencies.emplace_back(_frequencies[old_id]);
      new_ids_to_tokens.emplace_back(std::move(_ids_to_tokens[old_id]));
      new_tokens_to_ids.emplace(new_ids_to_tokens.back(), new_id);
    }

    _tokens_to_ids = std::move(new_tokens_to_ids);
    _ids_to_tokens = std::move(new_ids_to_tokens);
    _frequencies = std::move(new_frequencies);
  }